

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O3

void xc_gga_new(xc_func_type *func,int order,size_t np,double *rho,double *sigma,
               xc_gga_out_params *out)

{
  xc_gga_funcs_variants *pxVar1;
  xc_gga_funcs p_Var2;
  
  xc_gga_sanity_check(func->info,order,out);
  xc_gga_initalize(func,np,out);
  pxVar1 = func->info->gga;
  if (pxVar1 != (xc_gga_funcs_variants *)0x0) {
    if (func->nspin == 1) {
      p_Var2 = pxVar1->unpol[order];
    }
    else {
      p_Var2 = pxVar1->pol[order];
    }
    if (p_Var2 != (xc_gga_funcs)0x0) {
      (*p_Var2)(func,np,rho,sigma,out);
    }
  }
  if (func->mix_coef != (double *)0x0) {
    xc_mix_func(func,np,rho,sigma,0,0,*(undefined4 *)&out->zk,*(undefined4 *)&out->vrho,out->vsigma,
                0,0,*(undefined4 *)&out->v2rho2,*(undefined4 *)&out->v2rhosigma,0,0,out->v2sigma2,0,
                0,0,0,0,*(undefined4 *)&out->v3rho3,*(undefined4 *)&out->v3rho2sigma,0,0,
                out->v3rhosigma2,0,0,0,0,0,out->v3sigma3,0,0,0,0,0,0,0,0,0,
                *(undefined4 *)&out->v4rho4,*(undefined4 *)&out->v4rho3sigma,0,0,out->v4rho2sigma2,0
                ,0,0,0,0,out->v4rhosigma3,0,0,0,0,0,0,0,0,0,out->v4sigma4,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void xc_gga_new(const xc_func_type *func, int order, size_t np, const double *rho, const double *sigma,
            xc_gga_out_params *out)
{

  xc_gga_sanity_check(func->info, order, out);
  xc_gga_initalize(func, np, out);
  
  /* call the GGA routines */
  if(func->info->gga != NULL){
    if(func->nspin == XC_UNPOLARIZED){
      if(func->info->gga->unpol[order] != NULL)
        func->info->gga->unpol[order](func, np, rho, sigma, out);
    }else{
      if(func->info->gga->pol[order] != NULL)
        func->info->gga->pol[order](func, np, rho, sigma, out);
    }
  }

  if(func->mix_coef != NULL)
    xc_mix_func(func, np, rho, sigma, NULL, NULL, out->zk, out->vrho, out->vsigma, NULL, NULL,
                out->v2rho2, out->v2rhosigma, NULL, NULL, out->v2sigma2, NULL, NULL, NULL, NULL, NULL,
                out->v3rho3, out->v3rho2sigma, NULL, NULL, out->v3rhosigma2, NULL, NULL, NULL, NULL, NULL,
                out->v3sigma3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4rho4, out->v4rho3sigma, NULL, NULL, out->v4rho2sigma2, NULL, NULL, NULL, NULL, NULL,
                out->v4rhosigma3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4sigma4, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL);
}